

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O2

void __thiscall
spvtools::disassemble::InstructionDisassembler::EmitMaskOperand
          (InstructionDisassembler *this,ostream *stream,spv_operand_type_t type,uint32_t word)

{
  spv_result_t sVar1;
  spv_operand_desc in_RAX;
  uint32_t operand;
  int iVar2;
  spv_operand_desc entry;
  
  iVar2 = 0;
  operand = 1;
  entry = in_RAX;
  do {
    if (word == 0) {
      if (iVar2 == 0) {
        sVar1 = AssemblyGrammar::lookupOperand(this->grammar_,type,0,&entry);
        if (sVar1 == SPV_SUCCESS) {
          std::operator<<(stream,entry->name);
        }
      }
      return;
    }
    if ((operand & word) != 0) {
      sVar1 = AssemblyGrammar::lookupOperand(this->grammar_,type,operand,&entry);
      if (sVar1 != SPV_SUCCESS) {
        __assert_fail("false && \"should have caught this earlier\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/disassemble.cpp"
                      ,0x3e4,
                      "void spvtools::disassemble::InstructionDisassembler::EmitMaskOperand(std::ostream &, const spv_operand_type_t, const uint32_t) const"
                     );
      }
      if (iVar2 != 0) {
        std::operator<<(stream,"|");
      }
      word = word ^ operand;
      std::operator<<(stream,entry->name);
      iVar2 = iVar2 + 1;
    }
    operand = operand * 2;
  } while( true );
}

Assistant:

void InstructionDisassembler::EmitMaskOperand(std::ostream& stream,
                                              const spv_operand_type_t type,
                                              const uint32_t word) const {
  // Scan the mask from least significant bit to most significant bit.  For each
  // set bit, emit the name of that bit. Separate multiple names with '|'.
  uint32_t remaining_word = word;
  uint32_t mask;
  int num_emitted = 0;
  for (mask = 1; remaining_word; mask <<= 1) {
    if (remaining_word & mask) {
      remaining_word ^= mask;
      spv_operand_desc entry;
      if (grammar_.lookupOperand(type, mask, &entry))
        assert(false && "should have caught this earlier");
      if (num_emitted) stream << "|";
      stream << entry->name;
      num_emitted++;
    }
  }
  if (!num_emitted) {
    // An operand value of 0 was provided, so represent it by the name
    // of the 0 value. In many cases, that's "None".
    spv_operand_desc entry;
    if (SPV_SUCCESS == grammar_.lookupOperand(type, 0, &entry))
      stream << entry->name;
  }
}